

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestTestRunnerFixtureTestRunnerRunsTestsThatPassPredicate::RunImpl
          (TestTestRunnerFixtureTestRunnerRunsTestsThatPassPredicate *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_878 [8];
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper fixtureHelper;
  bool ctorOk;
  TestTestRunnerFixtureTestRunnerRunsTestsThatPassPredicate *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper::
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper
            ((TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *)local_878,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper>
            ((TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *)local_878,
             &(this->super_Test).m_details);
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper::
  ~TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper
            ((TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *)local_878);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, TestRunnerRunsTestsThatPassPredicate)
{
    Test should_run("goodtest");
    list.Add(&should_run);

    Test should_not_run("badtest");
	list.Add(&should_not_run);
 
	runner.RunTestsIf(list, NULL, RunTestIfNameIs("goodtest"), 0);
	CHECK_EQUAL(1, reporter.testRunCount);
    CHECK_EQUAL("goodtest", reporter.lastStartedTest);
}